

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

MidiEvent * __thiscall
smf::MidiEvent::operator=
          (MidiEvent *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  undefined4 local_1c;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  MidiEvent *this_local;
  
  clearVariables(this);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(bytes);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,sVar2);
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    if ((int)sVar2 <= local_1c) break;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (bytes,(long)local_1c);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(long)local_1c
                       );
    *pvVar4 = vVar1;
    local_1c = local_1c + 1;
  }
  return this;
}

Assistant:

MidiEvent& MidiEvent::operator=(const vector<uchar>& bytes) {
	clearVariables();
	this->resize(bytes.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = bytes[i];
	}
	return *this;
}